

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O3

void test_skiplist_delete_several_all(planck_unit_test_t *tc)

{
  int iVar1;
  bool bVar2;
  planck_unit_result_t pVar3;
  ion_status_t iVar4;
  long lVar5;
  long lVar6;
  ion_byte_t value [10];
  ion_skiplist_t skiplist;
  int local_78 [2];
  undefined1 local_70;
  ion_skiplist_t local_68;
  
  sl_initialize(&local_68,key_type_numeric_signed,4,10,7,1,4);
  local_68.super.compare = dictionary_compare_signed_value;
  local_70 = 0;
  local_78[1] = 0x65706957;
  local_78[0] = 9;
  do {
    iVar4 = sl_insert(&local_68,local_78,local_78 + 1);
    pVar3 = planck_unit_assert_true
                      (tc,(uint)(iVar4.error == '\0'),0x492,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar3 == '\0') goto LAB_00103989;
    pVar3 = planck_unit_assert_true
                      (tc,(uint)(((ulong)iVar4 & 0xffffffff00000000) == 0x100000000),0x493,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar3 == '\0') goto LAB_00103989;
    bVar2 = local_78[0] < 0x60;
    local_78[0] = local_78[0] + 3;
  } while (bVar2);
  local_78[0] = 9;
  do {
    iVar4 = sl_delete(&local_68,local_78);
    pVar3 = planck_unit_assert_true
                      (tc,(uint)(iVar4.error == '\0'),0x49e,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar3 == '\0') goto LAB_00103989;
    pVar3 = planck_unit_assert_true
                      (tc,(uint)(((ulong)iVar4 & 0xffffffff00000000) == 0x100000000),0x49f,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar3 == '\0') goto LAB_00103989;
    iVar1 = local_78[0] + 3;
    bVar2 = local_78[0] < 0x60;
    local_78[0] = iVar1;
  } while (bVar2);
  if (-1 < (long)(local_68.head)->height) {
    lVar5 = (long)(local_68.head)->height + 1;
    do {
      pVar3 = planck_unit_assert_true
                        (tc,(uint)((local_68.head)->next[lVar5 + -1] == (sl_node *)0x0),0x4ab,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                         ,"condition was false, expected true");
      if (pVar3 == '\0') {
LAB_00103989:
        longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
      }
      lVar6 = lVar5 + -1;
      bVar2 = 0 < lVar5;
      lVar5 = lVar6;
    } while (lVar6 != 0 && bVar2);
  }
  sl_destroy(&local_68);
  return;
}

Assistant:

void
test_skiplist_delete_several_all(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	ion_byte_t value[10];

	strcpy((char *) value, "Wipe");

	int i;

	for (i = 9; i < 99; i += 3) {
		ion_status_t status = sl_insert(&skiplist, (ion_key_t) &i, value);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	printf("%s\n", "** BEFORE **");
	print_skiplist(&skip_list);
#endif

	for (i = 9; i < 99; i += 3) {
		ion_status_t status = sl_delete(&skiplist, (ion_key_t) &i);

		PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
		PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);
	}

#if ION_DEBUG
	printf("%s\n", "** AFTER **");
	print_skiplist(&skip_list);
#endif

	ion_sl_node_t	*cursor = skiplist.head;
	ion_sl_level_t	h;

	for (h = cursor->height; h >= 0; h--) {
		PLANCK_UNIT_ASSERT_TRUE(tc, cursor->next[h] == NULL);
	}

	sl_destroy(&skiplist);
}